

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH32_hash_t ZSTD_XXH32_digest(XXH32_state_t *state)

{
  xxh_u32 xVar1;
  int local_14;
  xxh_u32 h32;
  XXH32_state_t *state_local;
  
  if (state->large_len == 0) {
    local_14 = state->v[2] + 0x165667b1;
  }
  else {
    local_14 = (state->v[0] << 1 | (uint)((int)state->v[0] < 0)) +
               (state->v[1] << 7 | state->v[1] >> 0x19) + (state->v[2] << 0xc | state->v[2] >> 0x14)
               + (state->v[3] << 0x12 | state->v[3] >> 0xe);
  }
  xVar1 = XXH32_finalize(state->total_len_32 + local_14,(xxh_u8 *)state->mem32,(ulong)state->memsize
                         ,XXH_aligned);
  return xVar1;
}

Assistant:

XXH_PUBLIC_API XXH32_hash_t XXH32_digest(const XXH32_state_t* state)
{
    xxh_u32 h32;

    if (state->large_len) {
        h32 = XXH_rotl32(state->v[0], 1)
            + XXH_rotl32(state->v[1], 7)
            + XXH_rotl32(state->v[2], 12)
            + XXH_rotl32(state->v[3], 18);
    } else {
        h32 = state->v[2] /* == seed */ + XXH_PRIME32_5;
    }

    h32 += state->total_len_32;

    return XXH32_finalize(h32, (const xxh_u8*)state->mem32, state->memsize, XXH_aligned);
}